

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::Functional::FmaCase::init(FmaCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  char *ctx_00;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  FmaCase *local_10;
  FmaCase *this_local;
  
  local_10 = this;
  pRVar3 = gles31::Context::getRenderContext
                     ((this->super_CommonFunctionCase).super_TestCase.m_context);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  ctx_00 = (char *)(ulong)local_18;
  bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
  if (!bVar1) {
    this_00 = gles31::Context::getContextInfo
                        ((this->super_CommonFunctionCase).super_TestCase.m_context);
    ctx_00 = "GL_EXT_gpu_shader5";
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_gpu_shader5");
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"GL_EXT_gpu_shader5 not supported",&local_39);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  iVar2 = CommonFunctionCase::init(&this->super_CommonFunctionCase,(EVP_PKEY_CTX *)ctx_00);
  return iVar2;
}

Assistant:

void init (void)
	{
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
				&& !m_context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
			throw tcu::NotSupportedError("GL_EXT_gpu_shader5 not supported");

		CommonFunctionCase::init();
	}